

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O3

void __thiscall
capnp::_::BuilderArena::BuilderArena
          (BuilderArena *this,MessageBuilder *message,
          ArrayPtr<capnp::MessageBuilder::SegmentInit> segments)

{
  word *pwVar1;
  size_t *psVar2;
  size_t *psVar3;
  Disposer *pDVar4;
  MultiSegmentState *pMVar5;
  Own<capnp::_::SegmentBuilder> *pOVar6;
  Own<capnp::_::SegmentBuilder> *pOVar7;
  ArrayPtr<const_capnp::word> *pAVar8;
  RemoveConst<kj::ArrayPtr<const_capnp::word>_> *pRVar9;
  ArrayPtr<const_capnp::word> *pAVar10;
  ArrayDisposer *pAVar11;
  anon_class_8_1_89918cff aVar12;
  RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *pRVar13;
  SegmentBuilder *pSVar14;
  MultiSegmentState *pMVar15;
  ulong uVar16;
  SegmentInit *pSVar17;
  SegmentBuilder *ptrCopy;
  size_t newSize;
  ArrayPtr<const_capnp::word> *pAVar18;
  uint uVar19;
  Vector<kj::Own<capnp::_::SegmentBuilder>_> builders;
  Vector<kj::ArrayPtr<const_capnp::word>_> forOutput;
  Vector<kj::Own<capnp::_::SegmentBuilder>_> local_e8;
  Vector<kj::ArrayPtr<const_capnp::word>_> local_c8;
  ArrayPtr<const_capnp::word> *local_a0;
  anon_class_8_1_89918cff local_98;
  Own<capnp::_::SegmentBuilder> *pOStack_90;
  Own<capnp::_::SegmentBuilder> *local_88;
  ArrayDisposer *pAStack_80;
  ArrayPtr<const_capnp::word> *local_78;
  ArrayPtr<const_capnp::word> *pAStack_70;
  ArrayPtr<const_capnp::word> *local_68;
  ArrayDisposer *local_60;
  SegmentInit *local_50;
  SegmentInit *local_48;
  ArrayDisposer *pAStack_40;
  ReadLimiter *local_38;
  
  uVar16 = segments.size_;
  pSVar17 = segments.ptr;
  (this->super_Arena)._vptr_Arena = (_func_int **)&PTR__BuilderArena_001c6290;
  this->message = message;
  (this->dummyLimiter).limit = 0xffffffffffffffff;
  (this->localCapTable).super_CapTableBuilder.super_CapTableReader._vptr_CapTableReader =
       (_func_int **)&PTR_extractCap_001c6348;
  (this->localCapTable).capTable.builder.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
  (this->localCapTable).capTable.builder.pos =
       (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
  (this->localCapTable).capTable.builder.endPtr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
  pwVar1 = (pSVar17->space).ptr;
  psVar2 = (size_t *)(pSVar17->space).size_;
  local_98.size = psVar2;
  if (((size_t *)0x1fffffff < psVar2) ||
     (local_98.size = (size_t *)pSVar17->wordsUsed, (size_t *)0x1fffffff < local_98.size)) {
    anon_func::anon_class_8_1_89918cff::operator()(&local_98);
  }
  local_38 = &this->dummyLimiter;
  (this->segment0).super_SegmentReader.arena = &this->super_Arena;
  (this->segment0).super_SegmentReader.id.value = 0;
  (this->segment0).super_SegmentReader.ptr.ptr = pwVar1;
  (this->segment0).super_SegmentReader.ptr.size_ = (size_t)psVar2;
  (this->segment0).super_SegmentReader.readLimiter = local_38;
  (this->segment0).pos = pwVar1 + (long)local_98.size;
  (this->segment0).readOnly = false;
  (this->segment0ForOutput).ptr = (word *)0x0;
  (this->segment0ForOutput).size_ = 0;
  (this->moreSegments).ptr.disposer = (Disposer *)0x0;
  (this->moreSegments).ptr.ptr = (MultiSegmentState *)0x0;
  this->segmentWithSpace = (SegmentBuilder *)0x0;
  if (uVar16 < 2) {
    this->segmentWithSpace = &this->segment0;
  }
  else {
    pRVar13 = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (0x10,0,uVar16 - 1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_e8.builder.endPtr = pRVar13 + (uVar16 - 1);
    local_e8.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_50 = (SegmentInit *)(uVar16 * 0x18);
    local_e8.builder.ptr = pRVar13;
    local_e8.builder.pos = pRVar13;
    local_a0 = (ArrayPtr<const_capnp::word> *)uVar16;
    if (local_50 != (SegmentInit *)0x18) {
      local_50 = (SegmentInit *)((long)&(local_50->space).ptr + (long)&(pSVar17->space).ptr);
      pSVar17 = pSVar17 + 1;
      uVar19 = 1;
      do {
        pwVar1 = (pSVar17->space).ptr;
        psVar2 = (size_t *)(pSVar17->space).size_;
        local_e8.builder.pos = pRVar13;
        if ((size_t *)0x1fffffff < psVar2) {
          local_98.size = psVar2;
          anon_func::anon_class_8_1_89918cff::operator()(&local_98);
        }
        psVar3 = (size_t *)pSVar17->wordsUsed;
        local_98.size = psVar3;
        local_48 = pSVar17;
        if ((size_t *)0x1fffffff < psVar3) {
          anon_func::anon_class_8_1_89918cff::operator()(&local_98);
        }
        pSVar14 = (SegmentBuilder *)operator_new(0x38);
        (pSVar14->super_SegmentReader).arena = &this->super_Arena;
        (pSVar14->super_SegmentReader).id.value = uVar19;
        (pSVar14->super_SegmentReader).ptr.ptr = pwVar1;
        (pSVar14->super_SegmentReader).ptr.size_ = (size_t)psVar2;
        (pSVar14->super_SegmentReader).readLimiter = local_38;
        pSVar14->pos = pwVar1 + (long)psVar3;
        pSVar14->readOnly = false;
        if (pRVar13 == local_e8.builder.endPtr) {
          newSize = (long)pRVar13 - (long)local_e8.builder.ptr >> 3;
          if (pRVar13 == local_e8.builder.ptr) {
            newSize = 4;
          }
          kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::setCapacity(&local_e8,newSize);
          pRVar13 = local_e8.builder.pos;
        }
        pRVar13->disposer = (Disposer *)&kj::_::HeapDisposer<capnp::_::SegmentBuilder>::instance;
        pRVar13->ptr = pSVar14;
        pRVar13 = pRVar13 + 1;
        pSVar17 = local_48 + 1;
        uVar19 = uVar19 + 1;
        local_e8.builder.pos = pRVar13;
      } while (pSVar17 != local_50);
    }
    pAVar8 = local_a0;
    local_c8.builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    local_c8.builder.pos = (ArrayPtr<const_capnp::word> *)0x0;
    local_c8.builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    pAVar18 = (ArrayPtr<const_capnp::word> *)4;
    if (4 < local_a0) {
      pAVar18 = local_a0;
    }
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::setCapacity(&local_c8,(size_t)pAVar18);
    pAVar11 = local_c8.builder.disposer;
    pAVar10 = local_c8.builder.endPtr;
    pAVar18 = local_c8.builder.ptr;
    pRVar13 = local_e8.builder.pos;
    pOVar6 = local_e8.builder.ptr;
    local_a0 = local_c8.builder.ptr + (long)pAVar8;
    while (local_c8.builder.pos < local_c8.builder.ptr + (long)pAVar8) {
      (local_c8.builder.pos)->ptr = (word *)0x0;
      (local_c8.builder.pos)->size_ = 0;
      local_a0 = local_c8.builder.pos + 1;
      local_c8.builder.pos = local_a0;
    }
    this->segmentWithSpace = local_e8.builder.pos[-1].ptr;
    local_98.size = (size_t *)local_e8.builder.ptr;
    pOStack_90 = local_e8.builder.pos;
    local_48 = (SegmentInit *)local_e8.builder.endPtr;
    pAStack_40 = local_e8.builder.disposer;
    local_88 = local_e8.builder.endPtr;
    pAStack_80 = local_e8.builder.disposer;
    local_e8.builder.ptr = (Own<capnp::_::SegmentBuilder> *)0x0;
    local_e8.builder.pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
    local_e8.builder.endPtr = (Own<capnp::_::SegmentBuilder> *)0x0;
    local_78 = local_c8.builder.ptr;
    local_68 = local_c8.builder.endPtr;
    local_60 = local_c8.builder.disposer;
    local_c8.builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    local_c8.builder.pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
    local_c8.builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    pAStack_70 = local_a0;
    pMVar15 = (MultiSegmentState *)operator_new(0x40);
    (pMVar15->builders).builder.endPtr = (Own<capnp::_::SegmentBuilder> *)local_48;
    (pMVar15->builders).builder.disposer = pAStack_40;
    (pMVar15->builders).builder.ptr = pOVar6;
    (pMVar15->builders).builder.pos = pRVar13;
    local_88 = (Own<capnp::_::SegmentBuilder> *)0x0;
    local_98.size = (size_t *)0x0;
    pOStack_90 = (Own<capnp::_::SegmentBuilder> *)0x0;
    (pMVar15->forOutput).builder.ptr = pAVar18;
    (pMVar15->forOutput).builder.pos = local_a0;
    (pMVar15->forOutput).builder.endPtr = pAVar10;
    (pMVar15->forOutput).builder.disposer = pAVar11;
    local_68 = (ArrayPtr<const_capnp::word> *)0x0;
    local_78 = (ArrayPtr<const_capnp::word> *)0x0;
    pAStack_70 = (ArrayPtr<const_capnp::word> *)0x0;
    pDVar4 = (this->moreSegments).ptr.disposer;
    pMVar5 = (this->moreSegments).ptr.ptr;
    (this->moreSegments).ptr.disposer =
         (Disposer *)&kj::_::HeapDisposer<capnp::_::BuilderArena::MultiSegmentState>::instance;
    (this->moreSegments).ptr.ptr = pMVar15;
    if ((pMVar5 != (MultiSegmentState *)0x0) &&
       ((*(code *)**(undefined8 **)pDVar4)(), pAVar10 = local_68, pAVar18 = pAStack_70,
       pAVar8 = local_78, local_78 != (ArrayPtr<const_capnp::word> *)0x0)) {
      local_78 = (ArrayPtr<const_capnp::word> *)0x0;
      pAStack_70 = (ArrayPtr<const_capnp::word> *)0x0;
      local_68 = (ArrayPtr<const_capnp::word> *)0x0;
      (*(code *)**(undefined8 **)local_60)
                (local_60,pAVar8,0x10,(long)pAVar18 - (long)pAVar8 >> 4,
                 (long)pAVar10 - (long)pAVar8 >> 4,0);
    }
    pOVar7 = local_88;
    pOVar6 = pOStack_90;
    aVar12.size = local_98.size;
    if (local_98.size != (size_t *)0x0) {
      local_98.size = (size_t *)0x0;
      pOStack_90 = (Own<capnp::_::SegmentBuilder> *)0x0;
      local_88 = (Own<capnp::_::SegmentBuilder> *)0x0;
      (*(code *)**(undefined8 **)pAStack_80)
                (pAStack_80,aVar12.size,0x10,(long)pOVar6 - (long)aVar12.size >> 4,
                 (long)pOVar7 - (long)aVar12.size >> 4,
                 kj::ArrayDisposer::Dispose_<kj::Own<capnp::_::SegmentBuilder>,_false>::destruct);
    }
    pAVar18 = local_c8.builder.endPtr;
    pRVar9 = local_c8.builder.pos;
    pAVar8 = local_c8.builder.ptr;
    if (local_c8.builder.ptr != (ArrayPtr<const_capnp::word> *)0x0) {
      local_c8.builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
      local_c8.builder.pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
      local_c8.builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
      (*(code *)**(undefined8 **)local_c8.builder.disposer)
                (local_c8.builder.disposer,pAVar8,0x10,(long)pRVar9 - (long)pAVar8 >> 4,
                 (long)pAVar18 - (long)pAVar8 >> 4,0);
    }
    pOVar7 = local_e8.builder.endPtr;
    pRVar13 = local_e8.builder.pos;
    pOVar6 = local_e8.builder.ptr;
    if (local_e8.builder.ptr != (Own<capnp::_::SegmentBuilder> *)0x0) {
      local_e8.builder.ptr = (Own<capnp::_::SegmentBuilder> *)0x0;
      local_e8.builder.pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
      local_e8.builder.endPtr = (Own<capnp::_::SegmentBuilder> *)0x0;
      (*(code *)**(undefined8 **)local_e8.builder.disposer)
                (local_e8.builder.disposer,pOVar6,0x10,(long)pRVar13 - (long)pOVar6 >> 4,
                 (long)pOVar7 - (long)pOVar6 >> 4,
                 kj::ArrayDisposer::Dispose_<kj::Own<capnp::_::SegmentBuilder>,_false>::destruct);
    }
  }
  return;
}

Assistant:

BuilderArena::BuilderArena(MessageBuilder* message,
                           kj::ArrayPtr<MessageBuilder::SegmentInit> segments)
    : message(message),
      segment0(this, SegmentId(0), segments[0].space.begin(),
               verifySegmentSize(segments[0].space.size()),
               &this->dummyLimiter, verifySegmentSize(segments[0].wordsUsed)) {
  if (segments.size() > 1) {
    kj::Vector<kj::Own<SegmentBuilder>> builders(segments.size() - 1);

    uint i = 1;
    for (auto& segment: segments.slice(1, segments.size())) {
      builders.add(kj::heap<SegmentBuilder>(
          this, SegmentId(i++), segment.space.begin(), verifySegmentSize(segment.space.size()),
          &this->dummyLimiter, verifySegmentSize(segment.wordsUsed)));
    }

    kj::Vector<kj::ArrayPtr<const word>> forOutput;
    forOutput.resize(segments.size());

    segmentWithSpace = builders.back();

    this->moreSegments = kj::heap<MultiSegmentState>(
        MultiSegmentState { kj::mv(builders), kj::mv(forOutput) });

  } else {
    segmentWithSpace = &segment0;
  }
}